

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

MOJOSHADER_astDataType *
build_datatype(Context_conflict *ctx,int isconst,MOJOSHADER_astDataType *dt,
              MOJOSHADER_astScalarOrArray *soa)

{
  MOJOSHADER_astDataType *pMVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  MOJOSHADER_astDataType *local_38;
  AstCalcData data;
  
  if ((soa->isarray == 0) != (soa->dimension == (MOJOSHADER_astExpression *)0x0)) {
    __assert_fail("(soa->isarray && soa->dimension) || (!soa->isarray && !soa->dimension)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x790,
                  "const MOJOSHADER_astDataType *build_datatype(Context *, const int, const MOJOSHADER_astDataType *, MOJOSHADER_astScalarOrArray *)"
                 );
  }
  reduce_datatype(ctx,dt);
  if ((soa->isarray != 0) || ((isconst == 0) == (int)dt->type < 0)) {
    local_38 = (MOJOSHADER_astDataType *)Malloc(ctx,0x20);
    if (local_38 != (MOJOSHADER_astDataType *)0x0) {
      iVar3 = buffer_append(ctx->garbage,&local_38,8);
      if (iVar3 != 0) {
        if (soa->isarray == 0) {
          if (soa->dimension == (MOJOSHADER_astExpression *)0x0) {
            pMVar1 = (dt->array).base;
            pcVar4 = (dt->user).name;
            iVar3 = *(int *)((long)dt + 0x18);
            iVar2 = *(int *)((long)dt + 0x1c);
            *(undefined8 *)local_38 = *(undefined8 *)dt;
            (local_38->array).base = pMVar1;
            (local_38->user).name = pcVar4;
            ((MOJOSHADER_astDataTypeFunction *)local_38)->num_params = iVar3;
            ((MOJOSHADER_astDataTypeFunction *)local_38)->intrinsic = iVar2;
            local_38->type = (uint)(isconst != 0) << 0x1f | local_38->type & 0x7fffffff;
            return local_38;
          }
          __assert_fail("soa->dimension == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x7aa,
                        "const MOJOSHADER_astDataType *build_datatype(Context *, const int, const MOJOSHADER_astDataType *, MOJOSHADER_astScalarOrArray *)"
                       );
        }
        local_38->type = MOJOSHADER_AST_DATATYPE_ARRAY;
        (local_38->array).base = dt;
        if (soa->dimension != (MOJOSHADER_astExpression *)0x0) {
          data.isflt = 0;
          data.value.f = 0.0;
          (local_38->array).elements = 0x10;
          iVar3 = calc_ast_const_expr(ctx,soa->dimension,&data);
          ctx->sourcefile = (soa->ast).filename;
          ctx->sourceline = (soa->ast).line;
          if (iVar3 == 0) {
            pcVar4 = "array dimensions not constant";
          }
          else if (data.isflt == 0) {
            if (-1 < data.value.i) {
              (local_38->array).elements = (int)data.value.i;
              return local_38;
            }
            pcVar4 = "array dimensions negative";
          }
          else {
            pcVar4 = "array dimensions not integer";
          }
          fail(ctx,pcVar4);
          return local_38;
        }
        (local_38->array).elements = -1;
        return local_38;
      }
      (*ctx->free)(local_38,ctx->malloc_data);
    }
    dt = (MOJOSHADER_astDataType *)0x0;
  }
  return dt;
}

Assistant:

static const MOJOSHADER_astDataType *build_datatype(Context *ctx,
                                            const int isconst,
                                            const MOJOSHADER_astDataType *dt,
                                            MOJOSHADER_astScalarOrArray *soa)
{
    MOJOSHADER_astDataType *retval = NULL;

    assert( (soa->isarray && soa->dimension) ||
            (!soa->isarray && !soa->dimension) );

    sanitize_datatype(ctx, dt);

    // see if we can just reuse the exist datatype.
    if (!soa->isarray)
    {
        const int c1 = (dt->type & MOJOSHADER_AST_DATATYPE_CONST) != 0;
        const int c2 = (isconst != 0);
        if (c1 == c2)
            return dt;  // reuse existing datatype!
    } // if

    retval = (MOJOSHADER_astDataType *) Malloc(ctx, sizeof (*retval));
    if (retval == NULL)
        return NULL;

    // !!! FIXME: this is hacky.
    if (!buffer_append(ctx->garbage, &retval, sizeof (retval)))
    {
        Free(ctx, retval);
        return NULL;
    } // if

    if (!soa->isarray)
    {
        assert(soa->dimension == NULL);
        memcpy(retval, dt, sizeof (MOJOSHADER_astDataType));
        if (isconst)
            retval->type |= MOJOSHADER_AST_DATATYPE_CONST;
        else
            retval->type &= ~MOJOSHADER_AST_DATATYPE_CONST;
        return retval;
    } // if

    retval->type = MOJOSHADER_AST_DATATYPE_ARRAY;
    retval->array.base = dt;
    if (soa->dimension == NULL)
    {
        retval->array.elements = -1;
        return retval;
    } // if

    // Run the expression to verify it's constant and produces a positive int.
    AstCalcData data;
    data.isflt = 0;
    data.value.i = 0;
    retval->array.elements = 16;  // sane default for failure.
    const int ok = calc_ast_const_expr(ctx, soa->dimension, &data);

    // reset error position.
    ctx->sourcefile = soa->ast.filename;
    ctx->sourceline = soa->ast.line;

    if (!ok)
        fail(ctx, "array dimensions not constant");
    else if (data.isflt)
        fail(ctx, "array dimensions not integer");
    else if (data.value.i < 0)
        fail(ctx, "array dimensions negative");
    else
        retval->array.elements = data.value.i;

    return retval;
}